

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall
QMainWindowLayout::insertToolBar(QMainWindowLayout *this,QToolBar *before,QToolBar *toolbar)

{
  QArrayDataPointer<int> *this_00;
  int *piVar1;
  QLayoutItem *item;
  long in_FS_OFFSET;
  QRect QVar2;
  QArrayDataPointer<int> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::addChildWidget((QLayout *)this,&toolbar->super_QWidget);
  item = QToolBarAreaLayout::insertToolBar((QToolBarAreaLayout *)(this + 0xa0),before,toolbar);
  if (((item != (QLayoutItem *)0x0) && (*(int *)(this + 0x3c0) <= *(int *)(this + 0x3c8))) &&
     (*(int *)(this + 0x3c4) <= *(int *)(this + 0x3cc))) {
    QToolBarAreaLayout::insertItem((QToolBarAreaLayout *)(this + 0x3d8),before,item);
  }
  if ((*(long *)(this + 0x7c0) != 0) && (**(int **)(this + 0x7b8) == 0)) {
    this_00 = (QArrayDataPointer<int> *)(this + 0x7b0);
    QToolBarAreaLayout::currentGapIndex((QList<int> *)&local_40,(QToolBarAreaLayout *)(this + 0xa0))
    ;
    QArrayDataPointer<int>::operator=(this_00,&local_40);
    piVar1 = (int *)CONCAT44(local_40.d._4_4_,local_40.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_40.d._4_4_,local_40.d._0_4_),4,0x10);
      }
    }
    if (*(long *)(this + 0x7c0) != 0) {
      local_40.d._0_4_ = 0;
      QtPrivate::QPodArrayOps<int>::emplace<int&>((QPodArrayOps<int> *)this_00,0,(int *)&local_40);
      QVar2 = QMainWindowLayoutState::itemRect
                        ((QMainWindowLayoutState *)(this + 0x88),(QList<int> *)this_00);
      *(QRect *)(this + 0x7c8) = QVar2;
    }
  }
  (**(code **)(*(long *)this + 0x70))(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::insertToolBar(QToolBar *before, QToolBar *toolbar)
{
    addChildWidget(toolbar);
    QLayoutItem *item = layoutState.toolBarAreaLayout.insertToolBar(before, toolbar);
    if (savedState.isValid() && item) {
        // copy the toolbar also in the saved state
        savedState.toolBarAreaLayout.insertItem(before, item);
    }
    if (!currentGapPos.isEmpty() && currentGapPos.constFirst() == 0) {
        currentGapPos = layoutState.toolBarAreaLayout.currentGapIndex();
        if (!currentGapPos.isEmpty()) {
            currentGapPos.prepend(0);
            currentGapRect = layoutState.itemRect(currentGapPos);
        }
    }
    invalidate();
}